

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_sender.c
# Opt level: O2

SEND_ONE_MESSAGE_RESULT
send_one_message(MESSAGE_SENDER_INSTANCE *message_sender,ASYNC_OPERATION_HANDLE pending_send,
                MESSAGE_HANDLE message)

{
  ulong uVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  LOGGER_LOG p_Var5;
  AMQP_VALUE pAVar6;
  AMQP_VALUE value;
  AMQP_VALUE pAVar7;
  ASYNC_OPERATION_HANDLE pAVar8;
  ulong uVar9;
  char *pcVar10;
  SEND_ONE_MESSAGE_RESULT SVar11;
  data value_00;
  data value_01;
  ulong in_stack_ffffffffffffff28;
  undefined4 uVar12;
  size_t local_c0;
  AMQP_VALUE local_b8;
  size_t encoded_size;
  AMQP_VALUE local_a8;
  AMQP_VALUE local_a0;
  AMQP_VALUE local_98;
  AMQP_VALUE message_body_amqp_value;
  undefined4 local_88;
  undefined4 uStack_84;
  MESSAGE_BODY_TYPE message_body_type;
  AMQP_VALUE msg_annotations;
  size_t body_data_count;
  AMQP_VALUE application_properties;
  PROPERTIES_HANDLE properties;
  message_format message_format;
  HEADER_HANDLE header;
  BINARY_DATA binary_data_1;
  
  iVar4 = message_get_body_type(message,&message_body_type);
  if ((iVar4 != 0) || (iVar4 = message_get_message_format(message,&message_format), iVar4 != 0)) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                ,"send_one_message",0xe4,1,"Failure getting message body type and/or message format"
               );
      return SEND_ONE_MESSAGE_ERROR;
    }
    return SEND_ONE_MESSAGE_ERROR;
  }
  header = (HEADER_HANDLE)0x0;
  properties = (PROPERTIES_HANDLE)0x0;
  application_properties = (AMQP_VALUE)0x0;
  body_data_count = 0;
  msg_annotations = (AMQP_VALUE)0x0;
  iVar4 = message_get_header(message,&header);
  pAVar6 = (AMQP_VALUE)0x0;
  local_c0 = 0;
  if (header == (HEADER_HANDLE)0x0 || iVar4 != 0) {
LAB_001575f0:
    iVar4 = message_get_message_annotations(message,&msg_annotations);
    if (msg_annotations != (AMQP_VALUE)0x0 && iVar4 == 0) {
      iVar4 = amqpvalue_get_encoded_size(msg_annotations,&encoded_size);
      if (iVar4 != 0) {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 != (LOGGER_LOG)0x0) {
          pcVar10 = "Cannot obtain message annotations encoded size";
          iVar4 = 0x115;
          goto LAB_00157827;
        }
        goto LAB_00157842;
      }
      local_c0 = local_c0 + encoded_size;
    }
    iVar4 = message_get_properties(message,&properties);
    if (properties == (PROPERTIES_HANDLE)0x0 || iVar4 != 0) {
      local_a8 = (AMQP_VALUE)0x0;
LAB_001576ec:
      iVar4 = message_get_application_properties(message,&application_properties);
      if (application_properties == (AMQP_VALUE)0x0 || iVar4 != 0) {
        local_b8 = (AMQP_VALUE)0x0;
LAB_00157782:
        value = local_a8;
        if (message_body_type == MESSAGE_BODY_TYPE_DATA) {
          iVar4 = message_get_body_amqp_data_count(message,&body_data_count);
          if (iVar4 == 0) {
            if (body_data_count == 0) {
              local_a0 = pAVar6;
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 != (LOGGER_LOG)0x0) {
                pcVar10 = "Body data count is zero";
                iVar4 = 399;
                goto LAB_00157899;
              }
              goto LAB_00157b78;
            }
            bVar2 = false;
            local_a0 = pAVar6;
            for (uVar9 = 0; value = local_a8, uVar9 < body_data_count; uVar9 = uVar9 + 1) {
              iVar4 = message_get_body_amqp_data_in_place
                                (message,uVar9,(BINARY_DATA *)&message_body_amqp_value);
              if (iVar4 == 0) {
                value_00.length = local_88;
                value_00.bytes = message_body_amqp_value;
                value_00._12_4_ = 0;
                pAVar6 = amqpvalue_create_data(value_00);
                if (pAVar6 == (AMQP_VALUE)0x0) {
                  p_Var5 = xlogging_get_log_function();
                  if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_00157acb;
                  iVar4 = 0x1a4;
                  pcVar10 = "Cannot create body AMQP data";
                  goto LAB_00157a24;
                }
                iVar4 = amqpvalue_get_encoded_size(pAVar6,&encoded_size);
                if (iVar4 == 0) {
                  local_c0 = local_c0 + encoded_size;
                }
                else {
                  p_Var5 = xlogging_get_log_function();
                  if (p_Var5 == (LOGGER_LOG)0x0) {
                    bVar2 = true;
                  }
                  else {
                    bVar2 = true;
                    (*p_Var5)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                              ,"send_one_message",0x1ab,1,"Cannot get body AMQP data encoded size");
                  }
                }
                amqpvalue_destroy(pAVar6);
              }
              else {
                p_Var5 = xlogging_get_log_function();
                if (p_Var5 == (LOGGER_LOG)0x0) {
LAB_00157acb:
                  bVar2 = true;
                }
                else {
                  in_stack_ffffffffffffff28 = in_stack_ffffffffffffff28 & 0xffffffff00000000;
                  iVar4 = 0x198;
                  pcVar10 = "Cannot get body AMQP data %u";
LAB_00157a24:
                  bVar2 = true;
                  (*p_Var5)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                            ,"send_one_message",iVar4,1,pcVar10);
                }
              }
            }
          }
          else {
            local_a0 = pAVar6;
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 == (LOGGER_LOG)0x0) {
LAB_00157b78:
              bVar2 = true;
            }
            else {
              pcVar10 = "Cannot get body AMQP data count";
              iVar4 = 0x188;
LAB_00157899:
              bVar2 = true;
              (*p_Var5)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                        ,"send_one_message",iVar4,1,pcVar10);
            }
          }
          pAVar7 = (AMQP_VALUE)0x0;
        }
        else {
          if (message_body_type != MESSAGE_BODY_TYPE_VALUE) {
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 != (LOGGER_LOG)0x0) {
              pcVar10 = "Unknown body type";
              iVar4 = 0x15c;
              goto LAB_001578d7;
            }
            goto LAB_00157b91;
          }
          iVar4 = message_get_body_amqp_value_in_place(message,&message_body_amqp_value);
          if (iVar4 == 0) {
            local_a0 = pAVar6;
            pAVar6 = amqpvalue_create_amqp_value(message_body_amqp_value);
            if (pAVar6 != (AMQP_VALUE)0x0) {
              local_98 = pAVar6;
              iVar4 = amqpvalue_get_encoded_size(pAVar6,&encoded_size);
              if (iVar4 == 0) {
                local_c0 = local_c0 + encoded_size;
                bVar2 = false;
                pAVar7 = local_98;
              }
              else {
                p_Var5 = xlogging_get_log_function();
                if (p_Var5 == (LOGGER_LOG)0x0) {
                  bVar2 = true;
                  pAVar7 = local_98;
                }
                else {
                  bVar2 = true;
                  (*p_Var5)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                            ,"send_one_message",0x174,1,"Cannot get body AMQP value encoded size");
                  pAVar7 = local_98;
                }
              }
              goto LAB_00157b7f;
            }
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_00157b78;
            pcVar10 = "Cannot create body AMQP value";
            iVar4 = 0x16d;
          }
          else {
            local_a0 = pAVar6;
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_00157b78;
            pcVar10 = "Cannot obtain AMQP value from body";
            iVar4 = 0x165;
          }
          bVar2 = true;
          (*p_Var5)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                    ,"send_one_message",iVar4,1,pcVar10);
          pAVar7 = (AMQP_VALUE)0x0;
        }
LAB_00157b7f:
        pAVar6 = local_a0;
        if (!bVar2) {
          local_98 = pAVar7;
          pAVar7 = (AMQP_VALUE)malloc(local_c0);
          pAVar6 = local_a0;
          local_88 = 0;
          uStack_84 = 0;
          message_body_amqp_value = pAVar7;
          if (header == (HEADER_HANDLE)0x0) {
            bVar2 = false;
          }
          else {
            iVar4 = amqpvalue_encode(local_a0,encode_bytes,&message_body_amqp_value);
            if (iVar4 == 0) {
              bVar2 = false;
            }
            else {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 == (LOGGER_LOG)0x0) {
                bVar2 = true;
              }
              else {
                bVar2 = true;
                (*p_Var5)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                          ,"send_one_message",0x1c9,1,"Cannot encode header value");
              }
            }
            log_message_chunk(message_sender,"Header:",pAVar6);
          }
          if (msg_annotations != (AMQP_VALUE)0x0 && !bVar2) {
            iVar4 = amqpvalue_encode(msg_annotations,encode_bytes,&message_body_amqp_value);
            if (iVar4 == 0) {
              bVar2 = false;
            }
            else {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 == (LOGGER_LOG)0x0) {
                bVar2 = true;
              }
              else {
                bVar2 = true;
                (*p_Var5)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                          ,"send_one_message",0x1d4,1,"Cannot encode message annotations value");
              }
            }
            log_message_chunk(message_sender,"Message Annotations:",msg_annotations);
          }
          if ((!bVar2) && (properties != (PROPERTIES_HANDLE)0x0)) {
            iVar4 = amqpvalue_encode(local_a8,encode_bytes,&message_body_amqp_value);
            if (iVar4 == 0) {
              bVar2 = false;
            }
            else {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 == (LOGGER_LOG)0x0) {
                bVar2 = true;
              }
              else {
                bVar2 = true;
                (*p_Var5)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                          ,"send_one_message",0x1df,1,"Cannot encode message properties value");
              }
            }
            log_message_chunk(message_sender,"Properties:",local_a8);
          }
          if ((!bVar2) && (application_properties != (AMQP_VALUE)0x0)) {
            iVar4 = amqpvalue_encode(local_b8,encode_bytes,&message_body_amqp_value);
            if (iVar4 == 0) {
              bVar2 = false;
            }
            else {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 == (LOGGER_LOG)0x0) {
                bVar2 = true;
              }
              else {
                bVar2 = true;
                (*p_Var5)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                          ,"send_one_message",0x1ea,1,"Cannot encode application properties value");
              }
            }
            log_message_chunk(message_sender,"Application properties:",local_b8);
          }
          value = local_a8;
          SVar11 = SEND_ONE_MESSAGE_ERROR;
          if (!bVar2) {
            if (message_body_type == MESSAGE_BODY_TYPE_DATA) {
              bVar2 = false;
              local_a0 = pAVar6;
              for (uVar9 = 0; value = local_a8, uVar9 < body_data_count; uVar9 = uVar9 + 1) {
                iVar4 = message_get_body_amqp_data_in_place(message,uVar9,&binary_data_1);
                if (iVar4 == 0) {
                  value_01._4_8_ = binary_data_1._4_8_;
                  value_01.bytes._0_4_ = (int)binary_data_1.bytes;
                  value_01._12_4_ = 0;
                  pAVar6 = amqpvalue_create_data(value_01);
                  if (pAVar6 == (AMQP_VALUE)0x0) {
                    p_Var5 = xlogging_get_log_function();
                    bVar2 = true;
                    pAVar6 = local_a0;
                    if (p_Var5 != (LOGGER_LOG)0x0) {
                      uVar12 = (undefined4)(in_stack_ffffffffffffff28 >> 0x20);
                      iVar4 = 0x21a;
                      pcVar10 = "Cannot create body AMQP data %u";
                      goto LAB_00157f43;
                    }
                  }
                  else {
                    iVar4 = amqpvalue_encode(pAVar6,encode_bytes,&message_body_amqp_value);
                    uVar12 = (undefined4)(in_stack_ffffffffffffff28 >> 0x20);
                    if (iVar4 != 0) {
                      p_Var5 = xlogging_get_log_function();
                      if (p_Var5 != (LOGGER_LOG)0x0) {
                        (*p_Var5)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                                  ,"send_one_message",0x221,1,"Cannot encode body AMQP data %u",
                                  CONCAT44(uVar12,(int)uVar9));
                      }
                      bVar2 = true;
                      value = local_a8;
                      pAVar6 = local_a0;
                      break;
                    }
                    amqpvalue_destroy(pAVar6);
                    pAVar6 = local_a0;
                  }
                }
                else {
                  p_Var5 = xlogging_get_log_function();
                  bVar2 = true;
                  if (p_Var5 != (LOGGER_LOG)0x0) {
                    uVar12 = (undefined4)(in_stack_ffffffffffffff28 >> 0x20);
                    iVar4 = 0x20e;
                    pcVar10 = "Cannot get AMQP data %u";
LAB_00157f43:
                    in_stack_ffffffffffffff28 = CONCAT44(uVar12,(int)uVar9);
                    (*p_Var5)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                              ,"send_one_message",iVar4,1,pcVar10,in_stack_ffffffffffffff28);
                    bVar2 = true;
                  }
                }
              }
LAB_0015809f:
              if (!bVar2) {
                *(undefined4 *)&pending_send[5].async_operation_cancel_handler = 1;
                pAVar8 = link_transfer_async(message_sender->link,message_format,
                                             (PAYLOAD *)&message_body_amqp_value,1,
                                             on_delivery_settled,pending_send,
                                             (LINK_TRANSFER_RESULT *)&binary_data_1,
                                             (tickcounter_ms_t)
                                             pending_send[6].async_operation_cancel_handler);
                if (pAVar8 == (ASYNC_OPERATION_HANDLE)0x0) {
                  if ((int)binary_data_1.bytes == 2) {
                    *(undefined4 *)&pending_send[5].async_operation_cancel_handler = 0;
                    SVar11 = SEND_ONE_MESSAGE_BUSY;
                  }
                  else {
                    p_Var5 = xlogging_get_log_function();
                    if (p_Var5 != (LOGGER_LOG)0x0) {
                      pcVar10 = "Error in link transfer";
                      iVar4 = 0x240;
                      goto LAB_0015800c;
                    }
                    SVar11 = SEND_ONE_MESSAGE_ERROR;
                  }
                }
                else {
                  uVar9 = 0xffffffffffffffff;
                  do {
                    SVar11 = SEND_ONE_MESSAGE_OK;
                    if (uVar9 - message_sender->message_count == -1) goto LAB_00157e42;
                    uVar1 = uVar9 + 1;
                    lVar3 = uVar9 + 1;
                    uVar9 = uVar1;
                  } while (message_sender->messages[lVar3] != pending_send);
                  if (uVar1 < message_sender->message_count) {
                    pending_send[7].async_operation_cancel_handler =
                         (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)pAVar8;
                    SVar11 = SEND_ONE_MESSAGE_OK;
                  }
                }
              }
            }
            else {
              if (message_body_type == MESSAGE_BODY_TYPE_VALUE) {
                iVar4 = amqpvalue_encode(local_98,encode_bytes,&message_body_amqp_value);
                if (iVar4 == 0) {
                  bVar2 = false;
                }
                else {
                  p_Var5 = xlogging_get_log_function();
                  if (p_Var5 == (LOGGER_LOG)0x0) {
                    bVar2 = true;
                  }
                  else {
                    bVar2 = true;
                    (*p_Var5)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                              ,"send_one_message",0x1fe,1,"Cannot encode body AMQP value");
                  }
                }
                log_message_chunk(message_sender,"Body - amqp value:",local_98);
                goto LAB_0015809f;
              }
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_00157e42;
              pcVar10 = "Unknown message type";
              iVar4 = 0x1f6;
LAB_0015800c:
              SVar11 = SEND_ONE_MESSAGE_ERROR;
              (*p_Var5)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                        ,"send_one_message",iVar4,1,pcVar10);
            }
          }
LAB_00157e42:
          free(pAVar7);
          if (local_98 != (AMQP_VALUE)0x0) {
            amqpvalue_destroy(local_98);
          }
          goto LAB_00157b96;
        }
      }
      else {
        local_b8 = amqpvalue_create_application_properties(application_properties);
        if (local_b8 == (AMQP_VALUE)0x0) {
          p_Var5 = xlogging_get_log_function();
          value = local_a8;
          if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_00157934;
          pcVar10 = "Cannot create application properties AMQP value";
          iVar4 = 0x13f;
          goto LAB_00157927;
        }
        iVar4 = amqpvalue_get_encoded_size(local_b8,&encoded_size);
        value = local_a8;
        if (iVar4 == 0) {
          local_c0 = local_c0 + encoded_size;
          goto LAB_00157782;
        }
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 != (LOGGER_LOG)0x0) {
          pcVar10 = "Cannot obtain application properties encoded size";
          iVar4 = 0x146;
LAB_001578d7:
          (*p_Var5)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                    ,"send_one_message",iVar4,1,pcVar10);
        }
      }
LAB_00157b91:
      SVar11 = SEND_ONE_MESSAGE_ERROR;
      goto LAB_00157b96;
    }
    value = amqpvalue_create_properties(properties);
    if (value != (AMQP_VALUE)0x0) {
      iVar4 = amqpvalue_get_encoded_size(value,&encoded_size);
      if (iVar4 == 0) {
        local_c0 = local_c0 + encoded_size;
        local_a8 = value;
        goto LAB_001576ec;
      }
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) {
LAB_00157934:
        SVar11 = SEND_ONE_MESSAGE_ERROR;
        local_b8 = (AMQP_VALUE)0x0;
        goto LAB_00157b96;
      }
      pcVar10 = "Cannot obtain message properties encoded size";
      iVar4 = 0x12d;
LAB_00157927:
      SVar11 = SEND_ONE_MESSAGE_ERROR;
      local_b8 = (AMQP_VALUE)0x0;
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                ,"send_one_message",iVar4,1,pcVar10);
      goto LAB_00157b96;
    }
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      pcVar10 = "Cannot create message properties AMQP value";
      iVar4 = 0x126;
      goto LAB_00157827;
    }
  }
  else {
    pAVar6 = amqpvalue_create_header(header);
    if (pAVar6 == (AMQP_VALUE)0x0) {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 != (LOGGER_LOG)0x0) {
        (*p_Var5)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                  ,"send_one_message",0xfc,1,"Cannot create header AMQP value");
      }
      pAVar6 = (AMQP_VALUE)0x0;
    }
    else {
      iVar4 = amqpvalue_get_encoded_size(pAVar6,&encoded_size);
      local_c0 = encoded_size;
      if (iVar4 == 0) goto LAB_001575f0;
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_00157842;
      pcVar10 = "Cannot obtain header encoded size";
      iVar4 = 0x103;
LAB_00157827:
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                ,"send_one_message",iVar4,1,pcVar10);
    }
  }
LAB_00157842:
  SVar11 = SEND_ONE_MESSAGE_ERROR;
  local_b8 = (AMQP_VALUE)0x0;
  value = (AMQP_VALUE)0x0;
LAB_00157b96:
  if (header != (HEADER_HANDLE)0x0) {
    header_destroy(header);
  }
  if (pAVar6 != (AMQP_VALUE)0x0) {
    amqpvalue_destroy(pAVar6);
  }
  if (msg_annotations != (AMQP_VALUE)0x0) {
    amqpvalue_destroy(msg_annotations);
  }
  if (application_properties != (AMQP_VALUE)0x0) {
    amqpvalue_destroy(application_properties);
  }
  if (local_b8 != (AMQP_VALUE)0x0) {
    amqpvalue_destroy(local_b8);
  }
  if (value != (AMQP_VALUE)0x0) {
    amqpvalue_destroy(value);
  }
  if (properties != (PROPERTIES_HANDLE)0x0) {
    properties_destroy(properties);
  }
  return SVar11;
}

Assistant:

static SEND_ONE_MESSAGE_RESULT send_one_message(MESSAGE_SENDER_INSTANCE* message_sender, ASYNC_OPERATION_HANDLE pending_send, MESSAGE_HANDLE message)
{
    SEND_ONE_MESSAGE_RESULT result;

    size_t encoded_size;
    size_t total_encoded_size = 0;
    MESSAGE_BODY_TYPE message_body_type;
    message_format message_format;

    if ((message_get_body_type(message, &message_body_type) != 0) ||
        (message_get_message_format(message, &message_format) != 0))
    {
        LogError("Failure getting message body type and/or message format");
        result = SEND_ONE_MESSAGE_ERROR;
    }
    else
    {
        // header
        HEADER_HANDLE header = NULL;
        AMQP_VALUE header_amqp_value = NULL;
        PROPERTIES_HANDLE properties = NULL;
        AMQP_VALUE properties_amqp_value = NULL;
        AMQP_VALUE application_properties = NULL;
        AMQP_VALUE application_properties_value = NULL;
        AMQP_VALUE body_amqp_value = NULL;
        size_t body_data_count = 0;
        AMQP_VALUE msg_annotations = NULL;
        bool is_error = false;

        // message header
        if ((message_get_header(message, &header) == 0) &&
            (header != NULL))
        {
            header_amqp_value = amqpvalue_create_header(header);
            if (header_amqp_value == NULL)
            {
                LogError("Cannot create header AMQP value");
                is_error = true;
            }
            else
            {
                if (amqpvalue_get_encoded_size(header_amqp_value, &encoded_size) != 0)
                {
                    LogError("Cannot obtain header encoded size");
                    is_error = true;
                }
                else
                {
                    total_encoded_size += encoded_size;
                }
            }

        }

        // message annotations
        if ((!is_error) &&
            (message_get_message_annotations(message, &msg_annotations) == 0) &&
            (msg_annotations != NULL))
        {
            if (amqpvalue_get_encoded_size(msg_annotations, &encoded_size) != 0)
            {
                LogError("Cannot obtain message annotations encoded size");
                is_error = true;
            }
            else
            {
                total_encoded_size += encoded_size;
            }
        }

        // properties
        if ((!is_error) &&
            (message_get_properties(message, &properties) == 0) &&
            (properties != NULL))
        {
            properties_amqp_value = amqpvalue_create_properties(properties);
            if (properties_amqp_value == NULL)
            {
                LogError("Cannot create message properties AMQP value");
                is_error = true;
            }
            else
            {
                if (amqpvalue_get_encoded_size(properties_amqp_value, &encoded_size) != 0)
                {
                    LogError("Cannot obtain message properties encoded size");
                    is_error = true;
                }
                else
                {
                    total_encoded_size += encoded_size;
                }
            }
        }

        // application properties
        if ((!is_error) &&
            (message_get_application_properties(message, &application_properties) == 0) &&
            (application_properties != NULL))
        {
            application_properties_value = amqpvalue_create_application_properties(application_properties);
            if (application_properties_value == NULL)
            {
                LogError("Cannot create application properties AMQP value");
                is_error = true;
            }
            else
            {
                if (amqpvalue_get_encoded_size(application_properties_value, &encoded_size) != 0)
                {
                    LogError("Cannot obtain application properties encoded size");
                    is_error = true;
                }
                else
                {
                    total_encoded_size += encoded_size;
                }
            }
        }

        if (is_error)
        {
            result = SEND_ONE_MESSAGE_ERROR;
        }
        else
        {
            result = SEND_ONE_MESSAGE_OK;

            // body - amqp data
            switch (message_body_type)
            {
            default:
                LogError("Unknown body type");
                result = SEND_ONE_MESSAGE_ERROR;
                break;

            case MESSAGE_BODY_TYPE_VALUE:
            {
                AMQP_VALUE message_body_amqp_value;
                if (message_get_body_amqp_value_in_place(message, &message_body_amqp_value) != 0)
                {
                    LogError("Cannot obtain AMQP value from body");
                    result = SEND_ONE_MESSAGE_ERROR;
                }
                else
                {
                    body_amqp_value = amqpvalue_create_amqp_value(message_body_amqp_value);
                    if (body_amqp_value == NULL)
                    {
                        LogError("Cannot create body AMQP value");
                        result = SEND_ONE_MESSAGE_ERROR;
                    }
                    else
                    {
                        if (amqpvalue_get_encoded_size(body_amqp_value, &encoded_size) != 0)
                        {
                            LogError("Cannot get body AMQP value encoded size");
                            result = SEND_ONE_MESSAGE_ERROR;
                        }
                        else
                        {
                            total_encoded_size += encoded_size;
                        }
                    }
                }

                break;
            }

            case MESSAGE_BODY_TYPE_DATA:
            {
                BINARY_DATA binary_data;
                size_t i;

                if (message_get_body_amqp_data_count(message, &body_data_count) != 0)
                {
                    LogError("Cannot get body AMQP data count");
                    result = SEND_ONE_MESSAGE_ERROR;
                }
                else
                {
                    if (body_data_count == 0)
                    {
                        LogError("Body data count is zero");
                        result = SEND_ONE_MESSAGE_ERROR;
                    }
                    else
                    {
                        for (i = 0; i < body_data_count; i++)
                        {
                            if (message_get_body_amqp_data_in_place(message, i, &binary_data) != 0)
                            {
                                LogError("Cannot get body AMQP data %u", (unsigned int)i);
                                result = SEND_ONE_MESSAGE_ERROR;
                            }
                            else
                            {
                                AMQP_VALUE body_amqp_data;
                                amqp_binary binary_value;
                                binary_value.bytes = binary_data.bytes;
                                binary_value.length = (uint32_t)binary_data.length;
                                body_amqp_data = amqpvalue_create_data(binary_value);
                                if (body_amqp_data == NULL)
                                {
                                    LogError("Cannot create body AMQP data");
                                    result = SEND_ONE_MESSAGE_ERROR;
                                }
                                else
                                {
                                    if (amqpvalue_get_encoded_size(body_amqp_data, &encoded_size) != 0)
                                    {
                                        LogError("Cannot get body AMQP data encoded size");
                                        result = SEND_ONE_MESSAGE_ERROR;
                                    }
                                    else
                                    {
                                        total_encoded_size += encoded_size;
                                    }

                                    amqpvalue_destroy(body_amqp_data);
                                }
                            }
                        }
                    }
                }
                break;
            }
            }

            if (result == 0)
            {
                void* data_bytes = malloc(total_encoded_size);
                PAYLOAD payload;
                payload.bytes = (const unsigned char*)data_bytes;
                payload.length = 0;
                result = SEND_ONE_MESSAGE_OK;

                if (header != NULL)
                {
                    if (amqpvalue_encode(header_amqp_value, encode_bytes, &payload) != 0)
                    {
                        LogError("Cannot encode header value");
                        result = SEND_ONE_MESSAGE_ERROR;
                    }

                    log_message_chunk(message_sender, "Header:", header_amqp_value);
                }

                if ((result == SEND_ONE_MESSAGE_OK) && (msg_annotations != NULL))
                {
                    if (amqpvalue_encode(msg_annotations, encode_bytes, &payload) != 0)
                    {
                        LogError("Cannot encode message annotations value");
                        result = SEND_ONE_MESSAGE_ERROR;
                    }

                    log_message_chunk(message_sender, "Message Annotations:", msg_annotations);
                }

                if ((result == SEND_ONE_MESSAGE_OK) && (properties != NULL))
                {
                    if (amqpvalue_encode(properties_amqp_value, encode_bytes, &payload) != 0)
                    {
                        LogError("Cannot encode message properties value");
                        result = SEND_ONE_MESSAGE_ERROR;
                    }

                    log_message_chunk(message_sender, "Properties:", properties_amqp_value);
                }

                if ((result == SEND_ONE_MESSAGE_OK) && (application_properties != NULL))
                {
                    if (amqpvalue_encode(application_properties_value, encode_bytes, &payload) != 0)
                    {
                        LogError("Cannot encode application properties value");
                        result = SEND_ONE_MESSAGE_ERROR;
                    }

                    log_message_chunk(message_sender, "Application properties:", application_properties_value);
                }

                if (result == SEND_ONE_MESSAGE_OK)
                {
                    switch (message_body_type)
                    {
                    default:
                        LogError("Unknown message type");
                        result = SEND_ONE_MESSAGE_ERROR;
                        break;

                    case MESSAGE_BODY_TYPE_VALUE:
                    {
                        if (amqpvalue_encode(body_amqp_value, encode_bytes, &payload) != 0)
                        {
                            LogError("Cannot encode body AMQP value");
                            result = SEND_ONE_MESSAGE_ERROR;
                        }

                        log_message_chunk(message_sender, "Body - amqp value:", body_amqp_value);
                        break;
                    }
                    case MESSAGE_BODY_TYPE_DATA:
                    {
                        BINARY_DATA binary_data;
                        size_t i;

                        for (i = 0; i < body_data_count; i++)
                        {
                            if (message_get_body_amqp_data_in_place(message, i, &binary_data) != 0)
                            {
                                LogError("Cannot get AMQP data %u", (unsigned int)i);
                                result = SEND_ONE_MESSAGE_ERROR;
                            }
                            else
                            {
                                AMQP_VALUE body_amqp_data;
                                amqp_binary binary_value;
                                binary_value.bytes = binary_data.bytes;
                                binary_value.length = (uint32_t)binary_data.length;
                                body_amqp_data = amqpvalue_create_data(binary_value);
                                if (body_amqp_data == NULL)
                                {
                                    LogError("Cannot create body AMQP data %u", (unsigned int)i);
                                    result = SEND_ONE_MESSAGE_ERROR;
                                }
                                else
                                {
                                    if (amqpvalue_encode(body_amqp_data, encode_bytes, &payload) != 0)
                                    {
                                        LogError("Cannot encode body AMQP data %u", (unsigned int)i);
                                        result = SEND_ONE_MESSAGE_ERROR;
                                        break;
                                    }

                                    amqpvalue_destroy(body_amqp_data);
                                }
                            }
                        }
                        break;
                    }
                    }
                }

                if (result == SEND_ONE_MESSAGE_OK)
                {
                    ASYNC_OPERATION_HANDLE transfer_async_operation;
                    LINK_TRANSFER_RESULT link_transfer_error;
                    MESSAGE_WITH_CALLBACK* message_with_callback = GET_ASYNC_OPERATION_CONTEXT(MESSAGE_WITH_CALLBACK, pending_send);
                    message_with_callback->message_send_state = MESSAGE_SEND_STATE_PENDING;

                    transfer_async_operation = link_transfer_async(message_sender->link, message_format, &payload, 1, on_delivery_settled, pending_send, &link_transfer_error, message_with_callback->timeout);
                    if (transfer_async_operation == NULL)
                    {
                        if (link_transfer_error == LINK_TRANSFER_BUSY)
                        {
                            message_with_callback->message_send_state = MESSAGE_SEND_STATE_NOT_SENT;
                            result = SEND_ONE_MESSAGE_BUSY;
                        }
                        else
                        {
                            LogError("Error in link transfer");
                            result = SEND_ONE_MESSAGE_ERROR;
                        }
                    }
                    else
                    {
                        // For messages that get atomically sent and settled by link_transfer_async,
                        // on_delivery_settled is invoked and the message destroyed.
                        // So at this point we shall verify if the message still exists and is in the queue.
                        if (is_message_in_queue(message_sender, pending_send))
                        {
                            message_with_callback->transfer_async_operation = transfer_async_operation;
                        }

                        result = SEND_ONE_MESSAGE_OK;
                    }
                }

                free(data_bytes);

                if (body_amqp_value != NULL)
                {
                    amqpvalue_destroy(body_amqp_value);
                }
            }
        }

        if (header != NULL)
        {
            header_destroy(header);
        }

        if (header_amqp_value != NULL)
        {
            amqpvalue_destroy(header_amqp_value);
        }

        if (msg_annotations != NULL)
        {
            annotations_destroy(msg_annotations);
        }

        if (application_properties != NULL)
        {
            amqpvalue_destroy(application_properties);
        }

        if (application_properties_value != NULL)
        {
            amqpvalue_destroy(application_properties_value);
        }

        if (properties_amqp_value != NULL)
        {
            amqpvalue_destroy(properties_amqp_value);
        }

        if (properties != NULL)
        {
            properties_destroy(properties);
        }
    }

    return result;
}